

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::visitExpression(EarlyCastFinder *this,Expression *curr)

{
  bool bVar1;
  Module *pMVar2;
  ulong local_198;
  size_t i_1;
  size_t i;
  undefined1 local_178 [8];
  ShallowEffectAnalyzer currAnalyzer;
  Expression *curr_local;
  EarlyCastFinder *this_local;
  
  currAnalyzer.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
       = (size_t)curr;
  pMVar2 = Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                        *)this);
  ShallowEffectAnalyzer::ShallowEffectAnalyzer
            ((ShallowEffectAnalyzer *)local_178,&this->options,pMVar2,
             (Expression *)
             currAnalyzer.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count);
  bVar1 = EffectAnalyzer::invalidates(&this->testRefCast,(EffectAnalyzer *)local_178);
  if (bVar1) {
    for (i_1 = 0; i_1 < this->numLocals; i_1 = i_1 + 1) {
      pMVar2 = Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
               ::getModule((Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                            *)this);
      flushRefCastResult(this,i_1,pMVar2);
    }
  }
  bVar1 = EffectAnalyzer::invalidates(&this->testRefAs,(EffectAnalyzer *)local_178);
  if (bVar1) {
    for (local_198 = 0; local_198 < this->numLocals; local_198 = local_198 + 1) {
      pMVar2 = Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
               ::getModule((Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                            *)this);
      flushRefAsResult(this,local_198,pMVar2);
    }
  }
  ShallowEffectAnalyzer::~ShallowEffectAnalyzer((ShallowEffectAnalyzer *)local_178);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // A new one is instantiated for each expression to determine
    // if a cast can be moved past it.
    ShallowEffectAnalyzer currAnalyzer(options, *getModule(), curr);

    if (testRefCast.invalidates(currAnalyzer)) {
      for (size_t i = 0; i < numLocals; i++) {
        flushRefCastResult(i, *getModule());
      }
    }

    if (testRefAs.invalidates(currAnalyzer)) {
      for (size_t i = 0; i < numLocals; i++) {
        flushRefAsResult(i, *getModule());
      }
    }
  }